

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

TIntermNode * __thiscall
glslang::HlslParseContext::transformEntryPoint
          (HlslParseContext *this,TSourceLoc *loc,TFunction *userFunction,TAttributes *attributes)

{
  int *piVar1;
  TIntermediate *pTVar2;
  char *pcVar3;
  undefined8 uVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TQualifier *pTVar8;
  undefined4 extraout_var_02;
  long lVar9;
  TType *pTVar22;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  TPoolAllocator *pTVar10;
  TIntermAggregate *pTVar11;
  undefined4 extraout_var_16;
  long *plVar12;
  long *plVar13;
  TIntermSymbol *pTVar14;
  TIntermAggregate *this_00;
  undefined4 extraout_var_18;
  TIntermTyped *pTVar15;
  TIntermConstantUnion *left;
  TVariable *pTVar16;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  TIntermSymbol *pTVar17;
  undefined4 extraout_var_21;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *pbVar18;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  ulong uVar19;
  pointer ppTVar20;
  uint uVar21;
  TIntermTyped *callingArgs;
  TVector<glslang::TVariable_*> argVars;
  TVector<glslang::TVariable_*> opaque_uniforms;
  TVector<glslang::TVariable_*> inputs;
  TVariable *entryPointOutput;
  TVector<glslang::TVariable_*> outputs;
  TIntermNode *synthFunctionDef;
  TFunction synthEntryPoint;
  TFunction callee;
  TType voidType;
  undefined8 *local_4e0;
  pointer local_4d8;
  TIntermTyped *local_4d0;
  TPoolAllocator *local_4c8;
  long lStack_4c0;
  long local_4b8;
  undefined8 uStack_4b0;
  TPoolAllocator *local_4a8;
  undefined8 *puStack_4a0;
  iterator local_498;
  TVariable **ppTStack_490;
  TVector<glslang::TVariable_*> local_488;
  TIntermAggregate *local_460;
  TVariable *local_458;
  TVariable *local_450;
  TVector<glslang::TVariable_*> local_448;
  undefined1 local_420 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  local_408 [8];
  TFunction local_388;
  TFunction local_228;
  TType local_c8;
  undefined4 extraout_var_17;
  
  iVar7 = (*(userFunction->super_TSymbol)._vptr_TSymbol[3])(userFunction);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  CONCAT44(extraout_var,iVar7),
                  (((this->super_TParseContextBase).super_TParseVersions.intermediate)->
                  entryPointName)._M_dataplus._M_p);
  if (iVar7 != 0) {
    remapNonEntryPointIO(this,userFunction);
    return (TIntermNode *)0x0;
  }
  this->entryPointFunction = userFunction;
  handleEntryPointAttributes(this,loc,attributes);
  local_488.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_488.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_488.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
  local_488.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_488.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Tp_alloc_type.allocator = GetThreadPoolAllocator();
  local_488.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_488.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_488.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_448.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_448.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
  local_448.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Tp_alloc_type.allocator = GetThreadPoolAllocator();
  local_448.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  remapEntryPointIO(this,userFunction,&local_450,&local_488,&local_448);
  pTVar16 = local_450;
  if (local_450 != (TVariable *)0x0) {
    iVar7 = (*(local_450->super_TSymbol)._vptr_TSymbol[0xc])(local_450);
    cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar7) + 0x128))
                      ((long *)CONCAT44(extraout_var_00,iVar7));
    if (cVar5 != '\0') {
      iVar7 = (*(pTVar16->super_TSymbol)._vptr_TSymbol[0xc])(pTVar16);
      pTVar8 = (TQualifier *)
               (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar7) + 0x58))
                         ((long *)CONCAT44(extraout_var_01,iVar7));
      bVar6 = TQualifier::isArrayedIo
                        (pTVar8,(this->super_TParseContextBase).super_TParseVersions.language);
      flatten(this,pTVar16,false,bVar6);
    }
    iVar7 = (*(pTVar16->super_TSymbol)._vptr_TSymbol[0xc])(pTVar16);
    lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar7) + 0x58))
                      ((long *)CONCAT44(extraout_var_02,iVar7));
    if (1 < (*(uint *)(lVar9 + 8) >> 7 & 0x1ff) - 0x21) {
      assignToInterface(this,pTVar16);
    }
  }
  ppTVar20 = local_488.
             super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
             super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (local_488.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
      super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_488.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
      super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pTVar22._0_4_ = (TType *)(*((*ppTVar20)->super_TSymbol)._vptr_TSymbol[0xc])();
      if (((this->super_TParseContextBase).super_TParseVersions.language != EShLangTessEvaluation)
         || (bVar6 = TType::operator()(pTVar22._0_4_), !bVar6)) {
        pTVar16 = *ppTVar20;
        iVar7 = (*(pTVar16->super_TSymbol)._vptr_TSymbol[0xc])(pTVar16);
        cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar7) + 0x128))
                          ((long *)CONCAT44(extraout_var_03,iVar7));
        if (cVar5 != '\0') {
          iVar7 = (*(pTVar16->super_TSymbol)._vptr_TSymbol[0xc])(pTVar16);
          pTVar8 = (TQualifier *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar7) + 0x58))
                             ((long *)CONCAT44(extraout_var_04,iVar7));
          bVar6 = TQualifier::isArrayedIo
                            (pTVar8,(this->super_TParseContextBase).super_TParseVersions.language);
          flatten(this,pTVar16,false,bVar6);
        }
        iVar7 = (*(pTVar16->super_TSymbol)._vptr_TSymbol[0xc])(pTVar16);
        lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar7) + 0x58))
                          ((long *)CONCAT44(extraout_var_05,iVar7));
        if (1 < (*(uint *)(lVar9 + 8) >> 7 & 0x1ff) - 0x21) {
          assignToInterface(this,pTVar16);
        }
      }
      ppTVar20 = ppTVar20 + 1;
    } while (ppTVar20 !=
             local_488.
             super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
             super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  ppTVar20 = local_448.
             super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
             super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (local_448.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
      super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_448.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
      super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pTVar16 = *ppTVar20;
      iVar7 = (*(pTVar16->super_TSymbol)._vptr_TSymbol[0xc])(pTVar16);
      cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar7) + 0x128))
                        ((long *)CONCAT44(extraout_var_06,iVar7));
      if (cVar5 != '\0') {
        iVar7 = (*(pTVar16->super_TSymbol)._vptr_TSymbol[0xc])(pTVar16);
        pTVar8 = (TQualifier *)
                 (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar7) + 0x58))
                           ((long *)CONCAT44(extraout_var_07,iVar7));
        bVar6 = TQualifier::isArrayedIo
                          (pTVar8,(this->super_TParseContextBase).super_TParseVersions.language);
        flatten(this,pTVar16,false,bVar6);
      }
      iVar7 = (*(pTVar16->super_TSymbol)._vptr_TSymbol[0xc])(pTVar16);
      lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar7) + 0x58))
                        ((long *)CONCAT44(extraout_var_08,iVar7));
      if (1 < (*(uint *)(lVar9 + 8) >> 7 & 0x1ff) - 0x21) {
        assignToInterface(this,pTVar16);
      }
      ppTVar20 = ppTVar20 + 1;
    } while (ppTVar20 !=
             local_448.
             super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
             super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessEvaluation) &&
     (ppTVar20 = local_488.
                 super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
                 super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
     local_488.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
     super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
     _M_impl.super__Vector_impl_data._M_start !=
     local_488.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
     super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
     _M_impl.super__Vector_impl_data._M_finish)) {
    do {
      pTVar22._0_4_ = (TType *)(*((*ppTVar20)->super_TSymbol)._vptr_TSymbol[0xc])();
      if (((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessEvaluation)
         && (bVar6 = TType::operator()(pTVar22._0_4_), bVar6)) {
        pTVar16 = *ppTVar20;
        iVar7 = (*(pTVar16->super_TSymbol)._vptr_TSymbol[0xc])(pTVar16);
        cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar7) + 0x128))
                          ((long *)CONCAT44(extraout_var_09,iVar7));
        if (cVar5 != '\0') {
          iVar7 = (*(pTVar16->super_TSymbol)._vptr_TSymbol[0xc])(pTVar16);
          pTVar8 = (TQualifier *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar7) + 0x58))
                             ((long *)CONCAT44(extraout_var_10,iVar7));
          bVar6 = TQualifier::isArrayedIo
                            (pTVar8,(this->super_TParseContextBase).super_TParseVersions.language);
          flatten(this,pTVar16,false,bVar6);
        }
        iVar7 = (*(pTVar16->super_TSymbol)._vptr_TSymbol[0xc])(pTVar16);
        lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar7) + 0x58))
                          ((long *)CONCAT44(extraout_var_11,iVar7));
        if (1 < (*(uint *)(lVar9 + 8) >> 7 & 0x1ff) - 0x21) {
          assignToInterface(this,pTVar16);
        }
      }
      ppTVar20 = ppTVar20 + 1;
    } while (ppTVar20 !=
             local_488.
             super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
             super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_498._M_current = (TVariable **)0x0;
  ppTStack_490 = (TVariable **)0x0;
  local_4a8 = (TPoolAllocator *)0x0;
  puStack_4a0 = (undefined8 *)0x0;
  local_4a8 = GetThreadPoolAllocator();
  puStack_4a0 = (undefined8 *)0x0;
  local_498._M_current = (TVariable **)0x0;
  ppTStack_490 = (TVariable **)0x0;
  iVar7 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x24])();
  if (0 < iVar7) {
    uVar19 = 0;
    do {
      iVar7 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x27])(userFunction,uVar19);
      pTVar22 = *(TType **)(CONCAT44(extraout_var_12,iVar7) + 8);
      iVar7 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x27])(userFunction);
      lVar9 = *(long *)CONCAT44(extraout_var_13,iVar7);
      iVar7 = (*pTVar22->_vptr_TType[10])(pTVar22);
      if ((*(uint *)(CONCAT44(extraout_var_14,iVar7) + 8) & 0x7f) == 5) {
        iVar7 = (*pTVar22->_vptr_TType[0x36])(pTVar22);
        if ((char)iVar7 == '\0') {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x40])
                    (this,loc,pTVar22,lVar9);
        }
        else {
          local_388.super_TSymbol._vptr_TSymbol =
               (_func_int **)makeInternalVariable(this,*(char **)(lVar9 + 8),pTVar22);
          if (local_498._M_current == ppTStack_490) {
            std::vector<glslang::TVariable*,glslang::pool_allocator<glslang::TVariable*>>::
            _M_realloc_insert<glslang::TVariable*const&>
                      ((vector<glslang::TVariable*,glslang::pool_allocator<glslang::TVariable*>> *)
                       &local_4a8,local_498,(TVariable **)&local_388);
          }
          else {
            *local_498._M_current = (TVariable *)local_388.super_TSymbol._vptr_TSymbol;
            local_498._M_current = local_498._M_current + 1;
          }
        }
      }
      uVar21 = (int)uVar19 + 1;
      uVar19 = (ulong)uVar21;
      iVar7 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x24])();
    } while ((int)uVar21 < iVar7);
  }
  TSymbolTable::push((this->super_TParseContextBase).symbolTable);
  TType::TType(&local_c8,EbtVoid,EvqTemporary,1,0,0,false);
  iVar7 = (*(userFunction->super_TSymbol)._vptr_TSymbol[3])(userFunction);
  TFunction::TFunction(&local_388,(TString *)CONCAT44(extraout_var_15,iVar7),&local_c8,EOpNull);
  pTVar10 = GetThreadPoolAllocator();
  pTVar11 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar10,0x188);
  TIntermAggregate::TIntermAggregate(pTVar11);
  local_460 = pTVar11;
  TIntermediate::setAggregateOperator
            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
             (TIntermNode *)pTVar11,EOpParameters,&local_c8,loc);
  pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  pcVar3 = (char *)(pTVar2->entryPointMangledName)._M_string_length;
  strlen(local_388.mangledName._M_dataplus._M_p);
  std::__cxx11::string::_M_replace
            ((ulong)&pTVar2->entryPointMangledName,0,pcVar3,
             (ulong)local_388.mangledName._M_dataplus._M_p);
  piVar1 = &((this->super_TParseContextBase).super_TParseVersions.intermediate)->numEntryPoints;
  *piVar1 = *piVar1 + 1;
  iVar7 = (*(userFunction->super_TSymbol)._vptr_TSymbol[3])(userFunction);
  TFunction::TFunction(&local_228,(TString *)CONCAT44(extraout_var_16,iVar7),&local_c8,EOpNull);
  (*(userFunction->super_TSymbol)._vptr_TSymbol[5])(userFunction,"@");
  local_4b8 = 0;
  uStack_4b0 = 0;
  local_4c8 = (TPoolAllocator *)0x0;
  lStack_4c0 = 0;
  local_4c8 = GetThreadPoolAllocator();
  lStack_4c0 = 0;
  local_4b8 = 0;
  uStack_4b0 = 0;
  pTVar10 = GetThreadPoolAllocator();
  pTVar11 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar10,0x188);
  TIntermAggregate::TIntermAggregate(pTVar11);
  local_4d8 = local_488.
              super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
              super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_4e0 = puStack_4a0;
  local_4d0 = (TIntermTyped *)0x0;
  iVar7 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x24])(userFunction);
  if (0 < iVar7) {
    uVar21 = 0;
    do {
      iVar7 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x27])(userFunction,(ulong)uVar21);
      plVar12 = (long *)CONCAT44(extraout_var_17,iVar7);
      local_420._0_8_ = makeInternalVariable(this,*(char **)(*plVar12 + 8),(TType *)plVar12[1]);
      std::vector<glslang::TVariable*,glslang::pool_allocator<glslang::TVariable*>>::
      emplace_back<glslang::TVariable*>
                ((vector<glslang::TVariable*,glslang::pool_allocator<glslang::TVariable*>> *)
                 &local_4c8,(TVariable **)local_420);
      plVar13 = (long *)(**(code **)(**(long **)(local_4b8 + -8) + 0x68))();
      pTVar8 = (TQualifier *)(**(code **)(*plVar13 + 0x50))(plVar13);
      pTVar8->semanticName = (char *)0x0;
      *(ulong *)&pTVar8->field_0x8 = *(ulong *)&pTVar8->field_0x8 & 0xf80000141fff0000;
      TQualifier::clearLayout(pTVar8);
      pTVar8->spirvStorageClass = -1;
      pTVar8->spirvDecorate = (TSpirvDecorate *)0x0;
      pTVar8->field_0xf = pTVar8->field_0xf & 0xe7;
      lVar9 = (**(code **)(*(long *)plVar12[1] + 0x50))();
      if ((*(uint *)(lVar9 + 8) & 0x1ff0000) == 0x950000) {
        this->inputPatch = *(TVariable **)(local_4b8 + -8);
      }
      pTVar14 = TIntermediate::addSymbol
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           *(TVariable **)(local_4b8 + -8));
      handleFunctionArgument(this,&local_228,&local_4d0,&pTVar14->super_TIntermTyped);
      lVar9 = (**(code **)(*(long *)plVar12[1] + 0x50))();
      if (((*(uint *)(lVar9 + 8) & 0x7f) < 0x14) &&
         ((0xd0000U >> (*(uint *)(lVar9 + 8) & 0x1f) & 1) != 0)) {
        this_00 = (TIntermAggregate *)
                  TIntermediate::addSymbol
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             *local_4d8);
        iVar7 = (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1e])(this_00);
        lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_18,iVar7) + 0x58))
                          ((long *)CONCAT44(extraout_var_18,iVar7));
        if (((*(uint *)(lVar9 + 8) & 0xff80) == 0x1f80) &&
           (((this->super_TParseContextBase).super_TParseVersions.intermediate)->dxPositionW == true
           )) {
          local_420._0_8_ = GetThreadPoolAllocator();
          local_420._8_8_ = local_408;
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          _M_construct<char_const*>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     local_420,"xyz","");
          local_458 = (TVariable *)
                      handleDotDereference(this,loc,(TIntermTyped *)this_00,(TString *)local_420);
          local_420._0_8_ = GetThreadPoolAllocator();
          local_420._8_8_ = local_408;
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          _M_construct<char_const*>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     local_420,"w","");
          pTVar15 = handleDotDereference(this,loc,(TIntermTyped *)this_00,(TString *)local_420);
          left = TIntermediate::addConstantUnion
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,1.0,
                            EbtFloat,loc,false);
          pTVar16 = (TVariable *)
                    TIntermediate::addBinaryMath
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               EOpDiv,&left->super_TIntermTyped,pTVar15,loc);
          pTVar10 = GetThreadPoolAllocator();
          this_00 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar10,0x188);
          TIntermAggregate::TIntermAggregate(this_00,EOpConstructVec4);
          iVar7 = (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])(this_00);
          local_420._0_8_ = local_458;
          std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
          emplace_back<TIntermNode*>
                    ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                     CONCAT44(extraout_var_19,iVar7),(TIntermNode **)local_420);
          iVar7 = (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])(this_00);
          local_420._0_8_ = pTVar16;
          std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
          emplace_back<TIntermNode*>
                    ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                     CONCAT44(extraout_var_20,iVar7),(TIntermNode **)local_420);
          TType::TType((TType *)local_420,EbtFloat,EvqTemporary,4,0,0,false);
          (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x1d])(this_00,(TType *)local_420);
          (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [1])(this_00,loc);
        }
        pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar15 = handleAssign(this,loc,EOpAssign,&pTVar14->super_TIntermTyped,
                               (TIntermTyped *)this_00);
        TIntermediate::growAggregate(pTVar2,(TIntermNode *)pTVar11,&pTVar15->super_TIntermNode);
        local_4d8 = local_4d8 + 1;
      }
      lVar9 = (**(code **)(*(long *)plVar12[1] + 0x50))();
      if ((*(uint *)(lVar9 + 8) & 0x7f) == 5) {
        cVar5 = (**(code **)(*(long *)plVar12[1] + 0x1b0))();
        pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        if (cVar5 == '\0') {
          pTVar15 = handleVariable(this,loc,(TString *)*plVar12);
          pTVar15 = handleAssign(this,loc,EOpAssign,&pTVar14->super_TIntermTyped,pTVar15);
          TIntermediate::growAggregate(pTVar2,(TIntermNode *)pTVar11,&pTVar15->super_TIntermNode);
        }
        else {
          pTVar17 = TIntermediate::addSymbol(pTVar2,(TVariable *)*local_4e0);
          pTVar15 = handleAssign(this,loc,EOpAssign,&pTVar14->super_TIntermTyped,
                                 &pTVar17->super_TIntermTyped);
          TIntermediate::growAggregate(pTVar2,(TIntermNode *)pTVar11,&pTVar15->super_TIntermNode);
          local_4e0 = local_4e0 + 1;
        }
      }
      uVar21 = uVar21 + 1;
      iVar7 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x24])();
    } while ((int)uVar21 < iVar7);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  _M_assign(&this->currentCaller,&local_388.mangledName);
  pTVar15 = handleFunctionCall(this,loc,&local_228,local_4d0);
  iVar7 = (*(userFunction->super_TSymbol)._vptr_TSymbol[6])();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  _M_assign(&this->currentCaller,
            (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
            CONCAT44(extraout_var_21,iVar7));
  if (local_450 == (TVariable *)0x0) goto LAB_00384aef;
  if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessControl) {
    pTVar14 = findTessLinkageSymbol(this,EbvInvocationId);
    if (pTVar14 == (TIntermSymbol *)0x0) {
      TType::TType((TType *)local_420,EbtUint,EvqIn,1,0,0,false);
      pTVar10 = GetThreadPoolAllocator();
      pbVar18 = (basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                TPoolAllocator::allocate(pTVar10,0x28);
      pTVar10 = GetThreadPoolAllocator();
      *(TPoolAllocator **)pbVar18 = pTVar10;
      *(basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> **)(pbVar18 + 8) =
           pbVar18 + 0x18;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>(pbVar18,"InvocationId","");
      local_408[0]._0_8_ = local_408[0]._M_allocated_capacity & 0xffffffffffff007f | 0x1980;
      pTVar16 = makeInternalVariable(this,*(char **)(pbVar18 + 8),(TType *)local_420);
      iVar7 = (*(pTVar16->super_TSymbol)._vptr_TSymbol[0xd])(pTVar16);
      lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_22,iVar7) + 0x50))
                        ((long *)CONCAT44(extraout_var_22,iVar7));
      uVar21 = (uint)*(ulong *)(lVar9 + 8) & 0x7f;
      if (uVar21 == 0x10) {
        uVar19 = 3;
LAB_00384a49:
        *(ulong *)(lVar9 + 8) = *(ulong *)(lVar9 + 8) & 0xffffffffffffff80 | uVar19;
      }
      else if (uVar21 == 0x11) {
        uVar19 = 4;
        goto LAB_00384a49;
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                (this,pTVar16);
      pTVar14 = TIntermediate::addSymbol
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,pTVar16
                          );
    }
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar17 = TIntermediate::addSymbol(pTVar2,local_450);
    pTVar14 = (TIntermSymbol *)
              TIntermediate::addIndex
                        (pTVar2,EOpIndexIndirect,&pTVar17->super_TIntermTyped,
                         &pTVar14->super_TIntermTyped,loc);
    iVar7 = (*(local_450->super_TSymbol)._vptr_TSymbol[0xc])(local_450);
    TType::TType((TType *)local_420,(TType *)CONCAT44(extraout_var_23,iVar7),0,false);
    (*(pTVar14->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1d])
              (pTVar14,(TType *)local_420);
  }
  else {
    pTVar14 = TIntermediate::addSymbol
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,local_450
                        );
  }
  pTVar15 = handleAssign(this,loc,EOpAssign,&pTVar14->super_TIntermTyped,pTVar15);
LAB_00384aef:
  TIntermediate::growAggregate
            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
             (TIntermNode *)pTVar11,&pTVar15->super_TIntermNode);
  ppTVar20 = local_448.
             super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
             super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  iVar7 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x24])();
  if (0 < iVar7) {
    uVar19 = 0;
    do {
      iVar7 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x27])(userFunction,uVar19 & 0xffffffff)
      ;
      lVar9 = (**(code **)(**(long **)(CONCAT44(extraout_var_24,iVar7) + 8) + 0x50))();
      if ((*(uint *)(lVar9 + 8) & 0x7f) - 0x11 < 2) {
        lVar9 = (**(code **)(**(long **)(CONCAT44(extraout_var_24,iVar7) + 8) + 0x50))();
        if ((*(uint *)(lVar9 + 8) & 0x1ff0000) == 0x930000) {
          this->gsStreamOutput = *ppTVar20;
        }
        else {
          pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          pTVar14 = TIntermediate::addSymbol(pTVar2,*ppTVar20);
          pTVar17 = TIntermediate::addSymbol
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               *(TVariable **)(lStack_4c0 + uVar19 * 8));
          pTVar15 = handleAssign(this,loc,EOpAssign,&pTVar14->super_TIntermTyped,
                                 &pTVar17->super_TIntermTyped);
          TIntermediate::growAggregate(pTVar2,(TIntermNode *)pTVar11,&pTVar15->super_TIntermNode);
        }
        ppTVar20 = ppTVar20 + 1;
      }
      uVar19 = uVar19 + 1;
      iVar7 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x24])();
    } while ((long)uVar19 < (long)iVar7);
  }
  (*(pTVar11->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x31])
            (pTVar11,1);
  local_420._0_8_ = local_460;
  handleFunctionBody(this,loc,&local_388,(TIntermNode *)pTVar11,(TIntermNode **)local_420);
  uVar4 = local_420._0_8_;
  this->entryPointFunctionBody = (TIntermNode *)pTVar11;
  TFunction::~TFunction(&local_228);
  TFunction::~TFunction(&local_388);
  return (TIntermNode *)(TIntermAggregate *)uVar4;
}

Assistant:

TIntermNode* HlslParseContext::transformEntryPoint(const TSourceLoc& loc, TFunction& userFunction,
                                                   const TAttributes& attributes)
{
    // Return true if this is a tessellation patch constant function input to a domain shader.
    const auto isDsPcfInput = [this](const TType& type) {
        return language == EShLangTessEvaluation &&
        type.contains([](const TType* t) {
                return t->getQualifier().builtIn == EbvTessLevelOuter ||
                       t->getQualifier().builtIn == EbvTessLevelInner;
            });
    };

    // if we aren't in the entry point, fix the IO as such and exit
    if (! isEntrypointName(userFunction.getName())) {
        remapNonEntryPointIO(userFunction);
        return nullptr;
    }

    entryPointFunction = &userFunction; // needed in finish()

    // Handle entry point attributes
    handleEntryPointAttributes(loc, attributes);

    // entry point logic...

    // Move parameters and return value to shader in/out
    TVariable* entryPointOutput; // gets created in remapEntryPointIO
    TVector<TVariable*> inputs;
    TVector<TVariable*> outputs;
    remapEntryPointIO(userFunction, entryPointOutput, inputs, outputs);

    // Further this return/in/out transform by flattening, splitting, and assigning locations
    const auto makeVariableInOut = [&](TVariable& variable) {
        if (variable.getType().isStruct()) {
            bool arrayed = variable.getType().getQualifier().isArrayedIo(language);
            flatten(variable, false /* don't track linkage here, it will be tracked in assignToInterface() */, arrayed);
        }
        // TODO: flatten arrays too
        // TODO: flatten everything in I/O
        // TODO: replace all split with flatten, make all paths can create flattened I/O, then split code can be removed

        // For clip and cull distance, multiple output variables potentially get merged
        // into one in assignClipCullDistance.  That code in assignClipCullDistance
        // handles the interface logic, so we avoid it here in that case.
        if (!isClipOrCullDistance(variable.getType()))
            assignToInterface(variable);
    };
    if (entryPointOutput != nullptr)
        makeVariableInOut(*entryPointOutput);
    for (auto it = inputs.begin(); it != inputs.end(); ++it)
        if (!isDsPcfInput((*it)->getType()))  // wait until the end for PCF input (see comment below)
            makeVariableInOut(*(*it));
    for (auto it = outputs.begin(); it != outputs.end(); ++it)
        makeVariableInOut(*(*it));

    // In the domain shader, PCF input must be at the end of the linkage.  That's because in the
    // hull shader there is no ordering: the output comes from the separate PCF, which does not
    // participate in the argument list.  That is always put at the end of the HS linkage, so the
    // input side of the DS must match.  The argument may be in any position in the DS argument list
    // however, so this ensures the linkage is built in the correct order regardless of argument order.
    if (language == EShLangTessEvaluation) {
        for (auto it = inputs.begin(); it != inputs.end(); ++it)
            if (isDsPcfInput((*it)->getType()))
                makeVariableInOut(*(*it));
    }

    // Add uniform parameters to the $Global uniform block.
    TVector<TVariable*> opaque_uniforms;
    for (int i = 0; i < userFunction.getParamCount(); i++) {
        TType& paramType = *userFunction[i].type;
        TString& paramName = *userFunction[i].name;
        if (paramType.getQualifier().storage == EvqUniform) {
            if (!paramType.containsOpaque()) {
                // Add it to the global uniform block.
                growGlobalUniformBlock(loc, paramType, paramName);
            } else {
                // Declare it as a separate variable.
                TVariable *var = makeInternalVariable(paramName.c_str(), paramType);
                opaque_uniforms.push_back(var);
            }
        }
    }

    // Synthesize the call

    pushScope(); // matches the one in handleFunctionBody()

    // new signature
    TType voidType(EbtVoid);
    TFunction synthEntryPoint(&userFunction.getName(), voidType);
    TIntermAggregate* synthParams = new TIntermAggregate();
    intermediate.setAggregateOperator(synthParams, EOpParameters, voidType, loc);
    intermediate.setEntryPointMangledName(synthEntryPoint.getMangledName().c_str());
    intermediate.incrementEntryPointCount();
    TFunction callee(&userFunction.getName(), voidType); // call based on old name, which is still in the symbol table

    // change original name
    userFunction.addPrefix("@");                         // change the name in the function, but not in the symbol table

    // Copy inputs (shader-in -> calling arg), while building up the call node
    TVector<TVariable*> argVars;
    TIntermAggregate* synthBody = new TIntermAggregate();
    auto inputIt = inputs.begin();
    auto opaqueUniformIt = opaque_uniforms.begin();
    TIntermTyped* callingArgs = nullptr;

    for (int i = 0; i < userFunction.getParamCount(); i++) {
        TParameter& param = userFunction[i];
        argVars.push_back(makeInternalVariable(*param.name, *param.type));
        argVars.back()->getWritableType().getQualifier().makeTemporary();

        // Track the input patch, which is the only non-builtin supported by hull shader PCF.
        if (param.getDeclaredBuiltIn() == EbvInputPatch)
            inputPatch = argVars.back();

        TIntermSymbol* arg = intermediate.addSymbol(*argVars.back());
        handleFunctionArgument(&callee, callingArgs, arg);
        if (param.type->getQualifier().isParamInput()) {
            TIntermTyped* input = intermediate.addSymbol(**inputIt);
            if (input->getType().getQualifier().builtIn == EbvFragCoord && intermediate.getDxPositionW()) {
                // Replace FragCoord W with reciprocal
                auto pos_xyz = handleDotDereference(loc, input, "xyz");
                auto pos_w   = handleDotDereference(loc, input, "w");
                auto one     = intermediate.addConstantUnion(1.0, EbtFloat, loc);
                auto recip_w = intermediate.addBinaryMath(EOpDiv, one, pos_w, loc);
                TIntermAggregate* dst = new TIntermAggregate(EOpConstructVec4);
                dst->getSequence().push_back(pos_xyz);
                dst->getSequence().push_back(recip_w);
                dst->setType(TType(EbtFloat, EvqTemporary, 4));
                dst->setLoc(loc);
                input = dst;
            }
            intermediate.growAggregate(synthBody, handleAssign(loc, EOpAssign, arg, input));
            inputIt++;
        }
        if (param.type->getQualifier().storage == EvqUniform) {
            if (!param.type->containsOpaque()) {
                // Look it up in the $Global uniform block.
                intermediate.growAggregate(synthBody, handleAssign(loc, EOpAssign, arg,
                                                                   handleVariable(loc, param.name)));
            } else {
                intermediate.growAggregate(synthBody, handleAssign(loc, EOpAssign, arg,
                                                                   intermediate.addSymbol(**opaqueUniformIt)));
                ++opaqueUniformIt;
            }
        }
    }

    // Call
    currentCaller = synthEntryPoint.getMangledName();
    TIntermTyped* callReturn = handleFunctionCall(loc, &callee, callingArgs);
    currentCaller = userFunction.getMangledName();

    // Return value
    if (entryPointOutput) {
        TIntermTyped* returnAssign;

        // For hull shaders, the wrapped entry point return value is written to
        // an array element as indexed by invocation ID, which we might have to make up.
        // This is required to match SPIR-V semantics.
        if (language == EShLangTessControl) {
            TIntermSymbol* invocationIdSym = findTessLinkageSymbol(EbvInvocationId);

            // If there is no user declared invocation ID, we must make one.
            if (invocationIdSym == nullptr) {
                TType invocationIdType(EbtUint, EvqIn, 1);
                TString* invocationIdName = NewPoolTString("InvocationId");
                invocationIdType.getQualifier().builtIn = EbvInvocationId;

                TVariable* variable = makeInternalVariable(*invocationIdName, invocationIdType);

                globalQualifierFix(loc, variable->getWritableType().getQualifier());
                trackLinkage(*variable);

                invocationIdSym = intermediate.addSymbol(*variable);
            }

            TIntermTyped* element = intermediate.addIndex(EOpIndexIndirect, intermediate.addSymbol(*entryPointOutput),
                                                          invocationIdSym, loc);

            // Set the type of the array element being dereferenced
            const TType derefElementType(entryPointOutput->getType(), 0);
            element->setType(derefElementType);

            returnAssign = handleAssign(loc, EOpAssign, element, callReturn);
        } else {
            returnAssign = handleAssign(loc, EOpAssign, intermediate.addSymbol(*entryPointOutput), callReturn);
        }
        intermediate.growAggregate(synthBody, returnAssign);
    } else
        intermediate.growAggregate(synthBody, callReturn);

    // Output copies
    auto outputIt = outputs.begin();
    for (int i = 0; i < userFunction.getParamCount(); i++) {
        TParameter& param = userFunction[i];

        // GS outputs are via emit, so we do not copy them here.
        if (param.type->getQualifier().isParamOutput()) {
            if (param.getDeclaredBuiltIn() == EbvGsOutputStream) {
                // GS output stream does not assign outputs here: it's the Append() method
                // which writes to the output, probably multiple times separated by Emit.
                // We merely remember the output to use, here.
                gsStreamOutput = *outputIt;
            } else {
                intermediate.growAggregate(synthBody, handleAssign(loc, EOpAssign,
                                                                   intermediate.addSymbol(**outputIt),
                                                                   intermediate.addSymbol(*argVars[i])));
            }

            outputIt++;
        }
    }

    // Put the pieces together to form a full function subtree
    // for the synthesized entry point.
    synthBody->setOperator(EOpSequence);
    TIntermNode* synthFunctionDef = synthParams;
    handleFunctionBody(loc, synthEntryPoint, synthBody, synthFunctionDef);

    entryPointFunctionBody = synthBody;

    return synthFunctionDef;
}